

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prepare.cc
# Opt level: O3

void __thiscall re2c::DFA::calc_stats(DFA *this)

{
  ulong uVar1;
  State *pSVar2;
  State *pSVar3;
  pointer ppSVar4;
  ulong uVar5;
  pointer ppSVar6;
  
  this->max_fill = 0;
  pSVar2 = this->head;
  if (pSVar2 == (State *)0x0) {
    ppSVar4 = (this->accepts).elems.
              super__Vector_base<const_re2c::State_*,_std::allocator<const_re2c::State_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    ppSVar6 = (this->accepts).elems.
              super__Vector_base<const_re2c::State_*,_std::allocator<const_re2c::State_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
    this->need_backup = ppSVar6 != ppSVar4;
  }
  else {
    uVar5 = 0;
    pSVar3 = pSVar2;
    do {
      uVar1 = pSVar3->fill;
      if (uVar5 < uVar1) {
        this->max_fill = uVar1;
        uVar5 = uVar1;
      }
      pSVar3 = pSVar3->next;
    } while (pSVar3 != (State *)0x0);
    ppSVar4 = (this->accepts).elems.
              super__Vector_base<const_re2c::State_*,_std::allocator<const_re2c::State_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    ppSVar6 = (this->accepts).elems.
              super__Vector_base<const_re2c::State_*,_std::allocator<const_re2c::State_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
    this->need_backup = ppSVar6 != ppSVar4;
    for (; pSVar2 != (State *)0x0; pSVar2 = pSVar2->next) {
      if (pSVar2->isPreCtxt == true) {
        this->need_backupctx = true;
      }
    }
  }
  this->need_accept = 8 < (ulong)((long)ppSVar6 - (long)ppSVar4);
  return;
}

Assistant:

void DFA::calc_stats ()
{
	// calculate 'YYMAXFILL'
	max_fill = 0;
	for (State * s = head; s; s = s->next)
	{
		if (max_fill < s->fill)
		{
			max_fill = s->fill;
		}
	}

	// determine if 'YYMARKER' or 'YYBACKUP'/'YYRESTORE' pair is used
	need_backup = accepts.size () > 0;

	// determine if 'YYCTXMARKER' or 'YYBACKUPCTX'/'YYRESTORECTX' pair is used
	for (State * s = head; s; s = s->next)
	{
		if (s->isPreCtxt)
		{
			need_backupctx = true;
		}
	}

	// determine if 'yyaccept' variable is used
	need_accept = accepts.size () > 1;
}